

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O2

string * fs_with_suffix_abi_cxx11_
                   (string *__return_storage_ptr__,string_view path,string_view new_suffix)

{
  path *this;
  string_view new_suffix_local;
  string_view path_local;
  path local_a0;
  path local_78;
  string stem;
  
  new_suffix_local._M_str = new_suffix._M_str;
  new_suffix_local._M_len = new_suffix._M_len;
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  fs_stem_abi_cxx11_(&stem,path);
  if (stem._M_string_length == 0) {
    fs_join_abi_cxx11_(__return_storage_ptr__,path,new_suffix);
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_78,&path_local,auto_format);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_a0,&new_suffix_local,auto_format);
    this = (path *)std::filesystem::__cxx11::path::replace_extension(&local_78);
    std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,this);
    std::filesystem::__cxx11::path::~path(&local_a0);
    std::filesystem::__cxx11::path::~path(&local_78);
  }
  std::__cxx11::string::~string((string *)&stem);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_with_suffix(std::string_view path, std::string_view new_suffix)
{
  const std::string stem = fs_stem(path);
  // handle directory case: stem is empty
  if(stem.empty())
    return fs_join(path, new_suffix);

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).replace_extension(new_suffix).generic_string();
#else
  const std::string p = fs_parent(path);

  const std::string r = (p == ".") ? stem : p + "/" + stem;

  return r + std::string(new_suffix);

#endif
}